

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_0::Thread::testContext(Thread *this,EGLContext context)

{
  Library *pLVar1;
  EGLDisplay pvVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  EGLSurface pvVar5;
  EGLSurface pvVar6;
  undefined1 local_50 [8];
  UniqueSurface surface;
  EGLint attribs [5];
  EGLContext context_local;
  Thread *this_local;
  
  if (this->m_surface == (EGLSurface)0x0) {
    surface.m_surface._0_4_ = 0x3057;
    surface.m_surface._4_4_ = 0x20;
    pLVar1 = this->m_egl;
    pvVar2 = this->m_display;
    iVar4 = (*pLVar1->_vptr_Library[10])(pLVar1,pvVar2,this->m_config,&surface.m_surface);
    eglu::UniqueSurface::UniqueSurface
              ((UniqueSurface *)local_50,pLVar1,pvVar2,(EGLSurface)CONCAT44(extraout_var,iVar4));
    dVar3 = (*this->m_egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0x59);
    pLVar1 = this->m_egl;
    pvVar2 = this->m_display;
    pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_50);
    pvVar6 = eglu::UniqueSurface::operator*((UniqueSurface *)local_50);
    (*pLVar1->_vptr_Library[0x27])(pLVar1,pvVar2,pvVar5,pvVar6,context);
    dVar3 = (*this->m_egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0x5b);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_50);
  }
  else {
    dVar3 = (*this->m_egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0x4b);
    (*this->m_egl->_vptr_Library[0x27])
              (this->m_egl,this->m_display,this->m_surface,this->m_surface,context);
    dVar3 = (*this->m_egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0x4d);
  }
  return;
}

Assistant:

void testContext (EGLContext context)
	{
		if (m_surface != EGL_NO_SURFACE)
		{
			EGLU_CHECK_MSG(m_egl, "eglCreateContext");
			m_egl.makeCurrent(m_display, m_surface, m_surface, context);
			EGLU_CHECK_MSG(m_egl, "eglMakeCurrent");
		}
		else
		{
			const EGLint attribs[] =
			{
				EGL_WIDTH, 32,
				EGL_HEIGHT, 32,
				EGL_NONE
			};
			const eglu::UniqueSurface surface (m_egl, m_display, m_egl.createPbufferSurface(m_display, m_config, attribs));

			EGLU_CHECK_MSG(m_egl, "eglCreateContext");
			m_egl.makeCurrent(m_display, *surface, *surface, context);
			EGLU_CHECK_MSG(m_egl, "eglMakeCurrent");
		}
	}